

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_validator_factory_4.hpp
# Opt level: O2

unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
 __thiscall
jsoncons::jsonschema::draft4::
schema_validator_factory_4<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
::make_maximum_validator_4
          (schema_validator_factory_4<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *context,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *sch,
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *parent)

{
  bool bVar1;
  schema_error *this_00;
  uri *in_R8;
  const_object_iterator cVar2;
  allocator<char> local_109;
  undefined1 local_108 [8];
  string message;
  string local_e0;
  uri schema_location;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&message,"maximum",(allocator<char> *)&local_e0);
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  make_schema_location
            (&schema_location,
             (compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)sch,&message);
  std::__cxx11::string::~string((string *)&message);
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number(parent);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message,"maximum must be a number value",(allocator<char> *)&local_e0);
    this_00 = (schema_error *)__cxa_allocate_exception(0x18);
    schema_error::schema_error(this_00,&message);
    __cxa_throw(this_00,&schema_error::typeinfo,schema_error::~schema_error);
  }
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)in_R8);
  if (bVar1) {
    message._M_dataplus._M_p = &DAT_00000010;
    message._M_string_length = (size_type)anon_var_dwarf_1ea1d9e;
    cVar2 = basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::find_abi_cxx11_
                      ((basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)in_R8,
                       (string_view_type *)&message);
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
              ((const_object_range_type *)&message,
               (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)in_R8);
    if ((((undefined1  [16])cVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
       ((message.field_2._M_local_buf[8] & 1U) == 0)) {
      if (cVar2.has_value_ != (bool)message.field_2._M_local_buf[8]) goto LAB_003fc4f0;
    }
    else if (cVar2.it_._M_current._M_current !=
             (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)message.field_2._M_allocated_capacity) {
LAB_003fc4f0:
      bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_bool
                        (&(cVar2.it_._M_current._M_current)->value_);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"maximum",&local_109)
        ;
        compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        ::get_custom_message
                  (&message,(compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                             *)sch,&local_e0);
        std::
        make_unique<jsoncons::jsonschema::exclusive_maximum_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::uri&,std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
                  ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_108,
                   in_R8,&schema_location.uri_string_,
                   (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)&message);
        goto LAB_003fc586;
      }
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"maximum",&local_109);
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  get_custom_message(&message,(compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                               *)sch,&local_e0);
  std::
  make_unique<jsoncons::jsonschema::maximum_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::uri&,std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_108,in_R8,
             &schema_location.uri_string_,
             (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)&message);
LAB_003fc586:
  (this->
  super_schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  )._vptr_schema_validator_factory_base = (_func_int **)local_108;
  local_108 = (undefined1  [8])0x0;
  std::__cxx11::string::~string((string *)&message);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&schema_location);
  return (__uniq_ptr_data<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
          )(__uniq_ptr_data<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<keyword_validator<Json>> make_maximum_validator_4(const compilation_context<Json>& context, 
            const Json& sch, const Json& parent)
        {
            uri schema_location = context.make_schema_location("maximum");
            if (!sch.is_number())
            {
                const std::string message("maximum must be a number value");
                JSONCONS_THROW(schema_error(message));
            }
            
            bool is_exclusive = false;

            if (parent.is_object())
            {
                auto it = parent.find("exclusiveMaximum");
                if (it != parent.object_range().end())
                {
                    is_exclusive = (*it).value().as_bool();
                }
            }
            if (is_exclusive)
            {
                return jsoncons::make_unique<exclusive_maximum_validator<Json>>(parent, schema_location, 
                    context.get_custom_message("maximum"), sch);
            }
            else
            {
                return jsoncons::make_unique<maximum_validator<Json>>(parent, schema_location,
                    context.get_custom_message("maximum"), sch);
            }
        }